

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.cpp
# Opt level: O3

void __thiscall
so_5::agent_t::create_event_subscription
          (agent_t *this,mbox_t *mbox_ref,type_index msg_type,state_t *target_state,
          event_handler_method_t *method,thread_safety_t thread_safety)

{
  subscription_storage_t *psVar1;
  control_block_t *pcVar2;
  undefined7 in_register_00000089;
  type_index local_38;
  
  local_38._M_target = msg_type._M_target;
  ensure_operation_is_on_working_thread(this,"create_event_subscription");
  psVar1 = (this->m_subscriptions)._M_t.
           super___uniq_ptr_impl<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_so_5::impl::subscription_storage_t_*,_std::default_delete<so_5::impl::subscription_storage_t>_>
           .super__Head_base<0UL,_so_5::impl::subscription_storage_t_*,_false>._M_head_impl;
  pcVar2 = detect_limit_for_message_type(this,&local_38);
  (*psVar1->_vptr_subscription_storage_t[2])
            (psVar1,mbox_ref,&local_38,pcVar2,target_state,method,
             (int)CONCAT71(in_register_00000089,thread_safety));
  return;
}

Assistant:

void
agent_t::create_event_subscription(
	const mbox_t & mbox_ref,
	std::type_index msg_type,
	const state_t & target_state,
	const event_handler_method_t & method,
	thread_safety_t thread_safety )
{
	// Since v.5.4.0 there is no need for locking agent's mutex
	// because this operation can be performed only on agent's
	// working thread.

	ensure_operation_is_on_working_thread( "create_event_subscription" );

	m_subscriptions->create_event_subscription(
			mbox_ref,
			msg_type,
			detect_limit_for_message_type( msg_type ),
			target_state,
			method,
			thread_safety );
}